

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86func.cpp
# Opt level: O0

void asmjit::v1_14::x86::FuncInternal::unpackValues(FuncDetail *func,FuncValuePack *pack)

{
  char cVar1;
  FuncValue *pFVar2;
  size_t in_stack_ffffffffffffff88;
  FuncValuePack *in_stack_ffffffffffffff90;
  TypeId typeId;
  FuncValuePack *pack_local;
  FuncDetail *func_local;
  
  pFVar2 = FuncValuePack::operator[](in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  cVar1 = (char)pFVar2->_data;
  if ((cVar1 == '(' || cVar1 == ')') && (((byte)*func & 1) == 1)) {
    pFVar2 = FuncValuePack::operator[](in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    pFVar2->_data = 0x27;
    pFVar2 = FuncValuePack::operator[](in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    pFVar2->_data = (uint)(byte)(cVar1 - 2);
  }
  return;
}

Assistant:

ASMJIT_FAVOR_SIZE void unpackValues(FuncDetail& func, FuncValuePack& pack) noexcept {
  TypeId typeId = pack[0].typeId();
  switch (typeId) {
    case TypeId::kInt64:
    case TypeId::kUInt64: {
      if (Environment::is32Bit(func.callConv().arch())) {
        // Convert a 64-bit return value to two 32-bit return values.
        pack[0].initTypeId(TypeId::kUInt32);
        pack[1].initTypeId(TypeId(uint32_t(typeId) - 2));
        break;
      }
      break;
    }

    default: {
      break;
    }
  }
}